

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O1

RepRef __thiscall
absl::lts_20250127::cord_internal::anon_unknown_16::CordRepAnalyzer::CountLinearReps
          (CordRepAnalyzer *this,RepRef rep,MemoryUsage *memory_usage)

{
  size_t *psVar1;
  long *plVar2;
  byte bVar3;
  CordzStatistics *pCVar4;
  CordRepKind CVar5;
  uint uVar6;
  sbyte sVar7;
  int iVar8;
  long lVar9;
  sbyte sVar10;
  long lVar11;
  int iVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  RepRef RVar17;
  RepRef local_30;
  
  sVar13 = rep.refcount;
  local_30.rep = rep.rep;
  local_30.refcount = sVar13;
  CVar5 = RepRef::tag(&local_30);
  if (CVar5 == SUBSTRING) {
    do {
      pCVar4 = this->statistics_;
      psVar1 = &pCVar4->node_count;
      *psVar1 = *psVar1 + 1;
      psVar1 = &(pCVar4->node_counts).substring;
      *psVar1 = *psVar1 + 1;
      memory_usage->total = memory_usage->total + 0x20;
      auVar14._8_4_ = (int)(sVar13 >> 0x20);
      auVar14._0_8_ = sVar13;
      auVar14._12_4_ = 0x45300000;
      memory_usage->fair_share =
           32.0 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar13) - 4503599627370496.0)) +
           memory_usage->fair_share;
      if ((local_30.rep)->tag != '\x01') {
        __assert_fail("IsSubstring()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x380,
                      "const CordRepSubstring *absl::cord_internal::CordRep::substring() const");
      }
      local_30.rep = *(CordRep **)&local_30.rep[1].refcount;
      if (local_30.rep == (CordRep *)0x0) {
        local_30.rep = (CordRep *)0x0;
        sVar13 = 0;
      }
      else {
        sVar13 = sVar13 * (long)(((local_30.rep)->refcount).count_.super___atomic_base<int>._M_i >>
                                1);
      }
      local_30.refcount = sVar13;
      CVar5 = RepRef::tag(&local_30);
    } while (CVar5 == SUBSTRING);
  }
  CVar5 = RepRef::tag(&local_30);
  if (CVar5 < FLAT) {
    CVar5 = RepRef::tag(&local_30);
    if (CVar5 != EXTERNAL) goto LAB_004cb46e;
    pCVar4 = this->statistics_;
    psVar1 = &pCVar4->node_count;
    *psVar1 = *psVar1 + 1;
    psVar1 = &(pCVar4->node_counts).external;
    *psVar1 = *psVar1 + 1;
    lVar9 = (local_30.rep)->length + 0x28;
    memory_usage->total = memory_usage->total + lVar9;
  }
  else {
    bVar3 = (local_30.rep)->tag;
    if ((bVar3 - 0xf9 < 7) || (bVar3 < 6)) {
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
    }
    iVar8 = -0xb8000;
    if (bVar3 < 0xbb) {
      iVar8 = -0xe80;
    }
    sVar10 = 0xc;
    if (bVar3 < 0xbb) {
      sVar10 = 6;
    }
    iVar12 = -0x10;
    if (0x42 < bVar3) {
      iVar12 = iVar8;
    }
    sVar7 = 3;
    if (0x42 < bVar3) {
      sVar7 = sVar10;
    }
    pCVar4 = this->statistics_;
    pCVar4->node_count = pCVar4->node_count + 1;
    (pCVar4->node_counts).flat = (pCVar4->node_counts).flat + 1;
    uVar6 = ((uint)bVar3 << sVar7) + iVar12;
    lVar9 = (long)(int)uVar6;
    lVar11 = 0x28;
    if ((((uVar6 < 0x41) || (lVar11 = 0x30, uVar6 < 0x81)) || (lVar11 = 0x38, uVar6 < 0x101)) ||
       ((lVar11 = 0x40, uVar6 < 0x201 || (lVar11 = 0x48, uVar6 < 0x401)))) {
      plVar2 = (long *)((long)&pCVar4->size + lVar11);
      *plVar2 = *plVar2 + 1;
    }
    memory_usage->total = memory_usage->total + lVar9;
  }
  auVar15._8_4_ = (int)((ulong)lVar9 >> 0x20);
  auVar15._0_8_ = lVar9;
  auVar15._12_4_ = 0x45300000;
  auVar16._8_4_ = (int)(sVar13 >> 0x20);
  auVar16._0_8_ = sVar13;
  auVar16._12_4_ = 0x45300000;
  memory_usage->fair_share =
       ((auVar15._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
       ((auVar16._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar13) - 4503599627370496.0)) + memory_usage->fair_share;
  local_30.rep = (CordRep *)0x0;
  sVar13 = 0;
LAB_004cb46e:
  RVar17.refcount = sVar13;
  RVar17.rep = local_30.rep;
  return RVar17;
}

Assistant:

RepRef CountLinearReps(RepRef rep, MemoryUsage& memory_usage) {
    // Consume all substrings
    while (rep.tag() == SUBSTRING) {
      statistics_.node_count++;
      statistics_.node_counts.substring++;
      memory_usage.Add(sizeof(CordRepSubstring), rep.refcount);
      rep = rep.Child(rep.rep->substring()->child);
    }

    // Consume possible FLAT
    if (rep.tag() >= FLAT) {
      size_t size = rep.rep->flat()->AllocatedSize();
      CountFlat(size);
      memory_usage.Add(size, rep.refcount);
      return RepRef{nullptr, 0};
    }

    // Consume possible external
    if (rep.tag() == EXTERNAL) {
      statistics_.node_count++;
      statistics_.node_counts.external++;
      size_t size = rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
      memory_usage.Add(size, rep.refcount);
      return RepRef{nullptr, 0};
    }

    return rep;
  }